

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

void standard_about_amulet_method_proc(Am_Object param_1)

{
  bool bVar1;
  Am_Object about_win;
  Am_Value dummy;
  Am_Object local_30;
  Am_Object local_28;
  Am_String local_20;
  Am_Value local_18;
  
  Am_Get_About_Amulet_Window();
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    set_dialog_position(&local_30,-10000,-10000);
    local_18.type = 0;
    local_18.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Am_Object(&local_28,&local_30);
    Am_Pop_Up_Window_And_Wait(&local_28,&local_18,true);
    Am_Object::~Am_Object(&local_28);
    Am_Value::~Am_Value(&local_18);
  }
  else {
    Am_String::Am_String(&local_20,"Can\'t find About Amulet Picture",true);
    Am_Show_Alert_Dialog(&local_20,-10000,-10000,true);
    Am_String::~Am_String(&local_20);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, standard_about_amulet_method,
                 (Am_Object /* cmd */))
{
  Am_Object about_win = Am_Get_About_Amulet_Window();
  if (!about_win.Valid()) {
    Am_Show_Alert_Dialog("Can't find About Amulet Picture");
    return;
  }
  set_dialog_position(about_win, Am_AT_CENTER_SCREEN, Am_AT_CENTER_SCREEN);
  Am_Value dummy;
  Am_Pop_Up_Window_And_Wait(about_win, dummy, true);
}